

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<boost::detail::tss_cleanup_function> * __thiscall
boost::shared_ptr<boost::detail::tss_cleanup_function>::operator=
          (shared_ptr<boost::detail::tss_cleanup_function> *this,
          shared_ptr<boost::detail::tss_cleanup_function> *r)

{
  shared_ptr<boost::detail::tss_cleanup_function> *in_RDI;
  shared_ptr<boost::detail::tss_cleanup_function> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<boost::detail::tss_cleanup_function> *)0x2a63de);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_SP_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }